

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

int mime_file_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  curl_mimepart *part;
  int whence_local;
  curl_off_t offset_local;
  void *instream_local;
  
  if (((whence == 0) && (offset == 0)) && (*(long *)((long)instream + 0x40) == 0)) {
    instream_local._4_4_ = 0;
  }
  else {
    iVar1 = mime_open_file((curl_mimepart *)instream);
    if (iVar1 == 0) {
      iVar1 = fseek(*(FILE **)((long)instream + 0x40),offset,whence);
      instream_local._4_4_ = 0;
      if (iVar1 != 0) {
        instream_local._4_4_ = 2;
      }
    }
    else {
      instream_local._4_4_ = 1;
    }
  }
  return instream_local._4_4_;
}

Assistant:

static int mime_file_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(whence == SEEK_SET && !offset && !part->fp)
    return CURL_SEEKFUNC_OK;   /* Not open: implicitly already at BOF. */

  if(mime_open_file(part))
    return CURL_SEEKFUNC_FAIL;

  return fseek(part->fp, (long) offset, whence) ?
    CURL_SEEKFUNC_CANTSEEK : CURL_SEEKFUNC_OK;
}